

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-mpi.c
# Opt level: O3

int big_block_mpi_grow_simple(BigBlock *bb,int Nfile_grow,size_t size_grow,MPI_Comm comm)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  size_t *fsize_grow;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  long lVar9;
  size_t asStack_40 [2];
  undefined1 local_2c [8];
  int rank;
  
  uVar4 = (ulong)(uint)Nfile_grow;
  lVar1 = -(uVar4 * 8 + 0xf & 0xfffffffffffffff0);
  fsize_grow = (size_t *)((long)asStack_40 + lVar1 + 8);
  if (0 < Nfile_grow) {
    lVar5 = uVar4 - 1;
    auVar6._8_4_ = (int)lVar5;
    auVar6._0_8_ = lVar5;
    auVar6._12_4_ = (int)((ulong)lVar5 >> 0x20);
    lVar5 = 0;
    auVar6 = auVar6 ^ _DAT_0010c170;
    uVar3 = 0;
    auVar7 = _DAT_0010c160;
    do {
      auVar8 = auVar7 ^ _DAT_0010c170;
      lVar9 = auVar7._8_8_;
      if ((bool)(~(auVar8._4_4_ == auVar6._4_4_ && auVar6._0_4_ < auVar8._0_4_ ||
                  auVar6._4_4_ < auVar8._4_4_) & 1)) {
        *(ulong *)((long)fsize_grow + lVar5) =
             ((auVar7._0_8_ + 1) * size_grow) / uVar4 - uVar3 / uVar4;
      }
      if ((auVar8._12_4_ != auVar6._12_4_ || auVar8._8_4_ <= auVar6._8_4_) &&
          auVar8._12_4_ <= auVar6._12_4_) {
        *(ulong *)(&stack0xffffffffffffffd0 + lVar5 + lVar1) =
             ((lVar9 + 1) * size_grow) / uVar4 - (size_grow + uVar3) / uVar4;
      }
      auVar7._0_8_ = auVar7._0_8_ + 2;
      auVar7._8_8_ = lVar9 + 2;
      uVar3 = uVar3 + size_grow * 2;
      lVar5 = lVar5 + 0x10;
    } while ((ulong)(Nfile_grow + 1U >> 1) << 4 != lVar5);
  }
  *(undefined8 *)((long)asStack_40 + lVar1) = 0x104830;
  MPI_Comm_rank(comm,local_2c);
  *(undefined8 *)((long)asStack_40 + lVar1) = 0x104841;
  iVar2 = big_block_mpi_grow(bb,Nfile_grow,fsize_grow,comm);
  return iVar2;
}

Assistant:

int
big_block_mpi_grow_simple(BigBlock * bb, int Nfile_grow, size_t size_grow, MPI_Comm comm)
{
    size_t fsize[Nfile_grow];
    int i;
    for(i = 0; i < Nfile_grow; i ++) {
        fsize[i] = size_grow * (i + 1) / Nfile_grow
                 - size_grow * (i) / Nfile_grow;
    }
    int rank;
    MPI_Comm_rank(comm, &rank);

    return big_block_mpi_grow(bb, Nfile_grow, fsize, comm);
}